

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenDDLExportTest.cpp
# Opt level: O1

void __thiscall
ODDLParser::OpenDDLExportTest_writeValueArrayTest_Test::~OpenDDLExportTest_writeValueArrayTest_Test
          (OpenDDLExportTest_writeValueArrayTest_Test *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x18);
  return;
}

Assistant:

TEST_F(OpenDDLExportTest, writeValueArrayTest) {
    OpenDDLExportMock myExporter;
    bool ok(true);
    std::string statement;
    ok = myExporter.writeValueArrayTester(nullptr, statement);
    EXPECT_FALSE(ok);
    EXPECT_TRUE(statement.empty());

    char token[] =
            "float[ 3 ]\n"
            "{\n"
            "    {1, 2, 3}\n"
            "}\n";

    size_t len(0);
    char *end = findEnd(token, len);
    DataArrayList *dataArrayList = nullptr;
    Value::ValueType type;

    char *in = OpenDDLParser::parsePrimitiveDataType(token, end, type, len);
    ASSERT_EQ(Value::ValueType::ddl_float, type);
    ASSERT_EQ(3U, len);
    in = OpenDDLParser::parseDataArrayList(in, end, type, &dataArrayList);
    ASSERT_FALSE(nullptr == dataArrayList);

    ok = myExporter.writeValueArrayTester(dataArrayList, statement);
    EXPECT_TRUE(ok);
    EXPECT_EQ("{ 1, 2, 3 }", statement);
    delete dataArrayList;
}